

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

void PHF::compact(phf *phf)

{
  size_t sVar1;
  anon_enum_32 aVar2;
  uint32_t *puVar3;
  size_t sVar4;
  long lVar5;
  
  if (phf->g_op - PHF_G_UINT32_MOD_R < 2) {
    if (phf->d_max < 0x100) {
      sVar1 = phf->r;
      if (sVar1 != 0) {
        puVar3 = phf->g;
        sVar4 = 0;
        do {
          *(char *)((long)puVar3 + sVar4) = (char)puVar3[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      aVar2 = phf->nodiv + PHF_G_UINT8_MOD_R;
      lVar5 = 1;
    }
    else {
      if (0xffff < phf->d_max) {
        return;
      }
      sVar1 = phf->r;
      if (sVar1 != 0) {
        puVar3 = phf->g;
        sVar4 = 0;
        do {
          *(short *)((long)puVar3 + sVar4 * 2) = (short)puVar3[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      aVar2 = phf->nodiv + PHF_G_UINT16_MOD_R;
      lVar5 = 2;
    }
    phf->g_op = aVar2;
    puVar3 = (uint32_t *)realloc(phf->g,lVar5 * phf->r);
    if (puVar3 != (uint32_t *)0x0) {
      phf->g = puVar3;
    }
  }
  return;
}

Assistant:

PHF_PUBLIC void PHF::compact(struct phf *phf) {
	size_t size = 0;
	void *tmp;

	switch (phf->g_op) {
	case phf::PHF_G_UINT32_MOD_R:
	case phf::PHF_G_UINT32_BAND_R:
		break;
	default:
		return; /* already compacted */
	}

	if (phf->d_max <= 255) {
		phf_memmove(reinterpret_cast<uint8_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT8_BAND_R : phf::PHF_G_UINT8_MOD_R;
		size = sizeof (uint8_t);
	} else if (phf->d_max <= 65535) {
		phf_memmove(reinterpret_cast<uint16_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT16_BAND_R : phf::PHF_G_UINT16_MOD_R;
		size = sizeof (uint16_t);
	} else {
		return; /* nothing to compact */
	}

	/* simply keep old array if realloc fails */
	if ((tmp = realloc(phf->g, phf->r * size)))
		phf->g = static_cast<uint32_t *>(tmp);
}